

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsetStringWithDataFieldWithoutDataLength::
~TestsetStringWithDataFieldWithoutDataLength(TestsetStringWithDataFieldWithoutDataLength *this)

{
  TestsetStringWithDataFieldWithoutDataLength *this_local;
  
  ~TestsetStringWithDataFieldWithoutDataLength(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(setStringWithDataFieldWithoutDataLength)
{
  FIX::Message object;
  DataDictionary dataDictionary("../spec/FIX42.xml");

  FIX::Headline headline("client");
  FIX42::News msg(headline);

  std::string s;
  char cc = -92;
  int data_len = rand() % 100;
  s.assign(data_len, cc);

  FIX::RawData data;
  data.setValue(s);

  msg.set(data);
  std::string str = msg.toString();

  CHECK_THROW(object.setString(str, true, &dataDictionary), InvalidMessage);
}